

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_mac_sign_finish(psa_mac_operation_t *operation,uint8_t *mac,size_t mac_size,size_t *mac_length)

{
  psa_status_t local_34;
  psa_status_t status;
  size_t *mac_length_local;
  size_t mac_size_local;
  uint8_t *mac_local;
  psa_mac_operation_t *operation_local;
  
  if (operation->alg == 0) {
    operation_local._4_4_ = -0x89;
  }
  else {
    *mac_length = mac_size;
    if (mac_size != 0) {
      memset(mac,0x21,mac_size);
    }
    if (((byte)operation->field_0x4 >> 4 & 1) == 0) {
      operation_local._4_4_ = -0x89;
    }
    else {
      local_34 = psa_mac_finish_internal(operation,mac,mac_size);
      if (local_34 == 0) {
        local_34 = psa_mac_abort(operation);
        if (local_34 == 0) {
          *mac_length = (ulong)operation->mac_size;
        }
        else {
          memset(mac,0x21,mac_size);
        }
      }
      else {
        psa_mac_abort(operation);
      }
      operation_local._4_4_ = local_34;
    }
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_mac_sign_finish( psa_mac_operation_t *operation,
                                  uint8_t *mac,
                                  size_t mac_size,
                                  size_t *mac_length )
{
    psa_status_t status;

    if( operation->alg == 0 )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    /* Fill the output buffer with something that isn't a valid mac
     * (barring an attack on the mac and deliberately-crafted input),
     * in case the caller doesn't check the return status properly. */
    *mac_length = mac_size;
    /* If mac_size is 0 then mac may be NULL and then the
     * call to memset would have undefined behavior. */
    if( mac_size != 0 )
        memset( mac, '!', mac_size );

    if( ! operation->is_sign )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    status = psa_mac_finish_internal( operation, mac, mac_size );

    if( status == PSA_SUCCESS )
    {
        status = psa_mac_abort( operation );
        if( status == PSA_SUCCESS )
            *mac_length = operation->mac_size;
        else
            memset( mac, '!', mac_size );
    }
    else
        psa_mac_abort( operation );
    return( status );
}